

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onHeaders
          (Connection *this,RequestConnectOrProtocolError *requestOrProtocolError)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  HttpOutputStream *pHVar1;
  Connection *pCVar2;
  kj *this_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar3;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *params_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_02;
  int iVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  SourceLocation location;
  bool bVar8;
  coroutine_handle<void> handle;
  void *pvVar9;
  int *in_RDX;
  LoopResult LVar10;
  PromiseAwaiter<void> *pPVar11;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *pPVar12;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>
  *location_00;
  char *local_50;
  anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2 aStack_48;
  undefined8 local_40;
  PromiseBase local_38;
  
  handle._M_fr_ptr = operator_new(0xd60);
  *(code **)handle._M_fr_ptr = onHeaders;
  *(code **)((long)handle._M_fr_ptr + 8) = onHeaders;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x10);
  *(int **)((long)handle._M_fr_ptr + 0xd50) = in_RDX;
  *(RequestConnectOrProtocolError **)((long)handle._M_fr_ptr + 0xd48) = requestOrProtocolError;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  aStack_48 = (anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2)0x4d6e07;
  local_40 = 0x1b00001dae;
  location.function = "onHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1dae;
  location.columnNumber = 0x1b;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine(this_00,handle,location);
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  if (requestOrProtocolError[5].field_1.space[0x18] == '\x01') {
    pHVar1 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0xd38);
    anon_unknown_36::HttpOutputStream::flush(pHVar1);
    pPVar11 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
    co_await<void>(pPVar11,(Promise<void> *)pHVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 0;
    bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar11,(CoroutineBase *)this_00);
    if (bVar8) {
      return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar11);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar11);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pHVar1);
    if (*(char *)(*(long *)(*(long *)((long)handle._M_fr_ptr + 0xd48) + 0x18) + 0x70) != '\x01')
    goto LAB_003a2138;
    bVar8 = anon_unknown_36::HttpInputStreamImpl::isCleanDrain
                      ((HttpInputStreamImpl *)(*(long *)((long)handle._M_fr_ptr + 0xd48) + 0x38));
    LVar10 = BREAK_LOOP_CONN_ERR - bVar8;
  }
  else {
    if (requestOrProtocolError[5].field_1.space[0x19] != '\x01') {
      iVar4 = *in_RDX;
      if (iVar4 == 1) {
        pCVar2 = (Connection *)((long)handle._M_fr_ptr + 0xd20);
        onRequest(pCVar2,(Request *)requestOrProtocolError);
        pPVar12 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                  ((long)handle._M_fr_ptr + 0x918);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar12,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar2);
        *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 3;
        bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)pPVar12,(CoroutineBase *)this_00);
        if (bVar8) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
        }
        LVar10 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                           (pPVar12);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,LVar10);
        kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar12);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pCVar2);
      }
      else if (iVar4 == 3) {
        if (in_RDX[2] == 0x1af) {
          heap<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>();
          this_01 = (kj *)((long)handle._M_fr_ptr + 0xd08);
          *(RequestConnectOrProtocolError **)((long)handle._M_fr_ptr + 0xcd8) =
               requestOrProtocolError;
          *(Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> **)
           ((long)handle._M_fr_ptr + 0xce0) =
               (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
               ((long)handle._M_fr_ptr + 0xcc8);
          evalNow<kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda()_1_>
                    (this_01,(anon_class_16_2_f7b14595 *)((long)handle._M_fr_ptr + 0xcd8));
          pOVar3 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                   ((long)handle._M_fr_ptr + 0xd10);
          *(char **)((long)handle._M_fr_ptr + 0xca0) =
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
          ;
          *(char **)((long)handle._M_fr_ptr + 0xca8) = "onHeaders";
          *(undefined8 *)((long)handle._M_fr_ptr + 0xcb0) = 0x1e00001dd9;
          Promise<void>::
          catch_<kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda(kj::Exception&&)_1_>
                    ((Promise<void> *)pOVar3,(anon_class_1_0_00000001_for_errorHandler *)this_01,
                     *(SourceLocation *)((long)handle._M_fr_ptr + 0xca0));
          params_1 = (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
                     ((long)handle._M_fr_ptr + 0xcb8);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xcb8) =
               *(undefined8 *)((long)handle._M_fr_ptr + 0xcc8);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xcc0) =
               *(undefined8 *)((long)handle._M_fr_ptr + 0xcd0);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xcd0) = 0;
          lVar5 = *(long *)((long)handle._M_fr_ptr + 0xd10);
          lVar6 = *(long *)(lVar5 + 8);
          if (lVar6 == 0 || (ulong)(lVar5 - lVar6) < 0x28) {
            pvVar9 = operator_new(0x400);
            location_00 = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>
                           *)((long)pvVar9 + 0x3d8);
            ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>
                      (location_00,pOVar3,params_1);
            *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
          }
          else {
            *(undefined8 *)(lVar5 + 8) = 0;
            location_00 = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>
                           *)(lVar5 + -0x28);
            ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>
                      (location_00,pOVar3,params_1);
            *(long *)(lVar5 + -0x20) = lVar6;
          }
          this_02 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                    ((long)handle._M_fr_ptr + 0xd18);
          ((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
            *)((long)handle._M_fr_ptr + 0xce8))->ptr =
               (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>
                *)0x0;
          this_02->ptr = (PromiseNode *)location_00;
          ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xd40))->ptr
               = (PromiseNode *)0x0;
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                     ((long)handle._M_fr_ptr + 0xd40));
          Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
          ::~Own((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
                  *)((long)handle._M_fr_ptr + 0xce8));
          Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own(params_1)
          ;
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar3);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
          lVar5 = *(long *)((long)&requestOrProtocolError->field_1 + 0x10);
          plVar7 = *(long **)(lVar5 + 8);
          (**(code **)(*plVar7 + 0x10))
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                     ((long)handle._M_fr_ptr + 0xd00),plVar7,*(undefined8 *)(lVar5 + 0x40));
          pOVar3 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                   ((long)handle._M_fr_ptr + 0xcf8);
          *(char **)((long)handle._M_fr_ptr + 0xc88) =
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
          ;
          *(char **)((long)handle._M_fr_ptr + 0xc90) = "onHeaders";
          *(undefined8 *)((long)handle._M_fr_ptr + 0xc98) = 0x1400001dde;
          Promise<void>::exclusiveJoin
                    ((Promise<void> *)pOVar3,(Promise<void> *)this_02,
                     *(SourceLocation *)((long)handle._M_fr_ptr + 0xc88));
          pPVar11 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0xad0);
          co_await<void>(pPVar11,(Promise<void> *)pOVar3);
          *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 4;
          bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                            ((PromiseAwaiterBase *)pPVar11,(CoroutineBase *)this_00);
          if (bVar8) {
            return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr
            ;
          }
          kj::_::PromiseAwaiter<void>::await_resume(pPVar11);
          kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar11);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar3);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                     ((long)handle._M_fr_ptr + 0xd00));
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_02);
          Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own
                    ((Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
                     ((long)handle._M_fr_ptr + 0xcc8));
        }
        local_50 = (char *)CONCAT44(local_50._4_4_,1);
        aStack_48.field1 = aStack_48.field1 & 0xffffffff00000000;
        kj::_::NullableValue<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>::
        emplace<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>
                  ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)
                   (*(long *)((long)handle._M_fr_ptr + 0xd48) + 0x148),
                   (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&local_50);
        pCVar2 = (Connection *)((long)handle._M_fr_ptr + 0xcf0);
        sendError(pCVar2,*(ProtocolError *)(*(long *)((long)handle._M_fr_ptr + 0xd50) + 8));
        pPVar12 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                  ((long)handle._M_fr_ptr + 0x3f0);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar12,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar2);
        *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 5;
        bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)pPVar12,(CoroutineBase *)this_00);
        if (bVar8) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
        }
        LVar10 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                           (pPVar12);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,LVar10);
        kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar12);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pCVar2);
      }
      else {
        if (iVar4 != 2) {
          kj::_::unreachable();
        }
        pCVar2 = (Connection *)((long)handle._M_fr_ptr + 0xd28);
        onConnect(pCVar2,(ConnectRequest *)requestOrProtocolError);
        pPVar12 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                  ((long)handle._M_fr_ptr + 0x760);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar12,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar2);
        *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 2;
        bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)pPVar12,(CoroutineBase *)this_00);
        if (bVar8) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
        }
        LVar10 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                           (pPVar12);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,LVar10);
        kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar12);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pCVar2);
      }
      goto LAB_003a2143;
    }
    pHVar1 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0xd30);
    anon_unknown_36::HttpOutputStream::flush(pHVar1);
    pPVar11 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x5a8);
    co_await<void>(pPVar11,(Promise<void> *)pHVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 1;
    bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar11,(CoroutineBase *)this_00);
    if (bVar8) {
      return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar11);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar11);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pHVar1);
LAB_003a2138:
    LVar10 = BREAK_LOOP_CONN_ERR;
  }
  kj::_::
  CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
  ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                  *)this_00,LVar10);
LAB_003a2143:
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0xd58) = 6;
  return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
}

Assistant:

kj::Promise<LoopResult> onHeaders(HttpHeaders::RequestConnectOrProtocolError&& requestOrProtocolError) {
    if (timedOut) {
      // Client took too long to send anything, so we're going to close the connection. In
      // theory, we should send back an HTTP 408 error -- it is designed exactly for this
      // purpose. Alas, in practice, Google Chrome does not have any special handling for 408
      // errors -- it will assume the error is a response to the next request it tries to send,
      // and will happily serve the error to the user. OTOH, if we simply close the connection,
      // Chrome does the "right thing", apparently. (Though I'm not sure what happens if a
      // request is in-flight when we close... if it's a GET, the browser should retry. But if
      // it's a POST, retrying may be dangerous. This is why 408 exists -- it unambiguously
      // tells the client that it should retry.)
      //
      // Also note that if we ever decide to send 408 again, we might want to send some other
      // error in the case that the server is draining, which also sets timedOut = true; see
      // above.

      co_await httpOutput.flush();
      co_return (server.draining && httpInput.isCleanDrain()) ? BREAK_LOOP_CONN_OK : BREAK_LOOP_CONN_ERR;
    }

    if (closed) {
      // Client closed connection. Close our end too.
      co_await httpOutput.flush();
      co_return BREAK_LOOP_CONN_ERR;
    }

    KJ_SWITCH_ONEOF(requestOrProtocolError) {
      KJ_CASE_ONEOF(request, HttpHeaders::ConnectRequest) {
        co_return co_await onConnect(request);
      }
      KJ_CASE_ONEOF(request, HttpHeaders::Request) {
        co_return co_await onRequest(request);
      }
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        // Bad request.

        auto needClientGrace = protocolError.statusCode == 431;
        if (needClientGrace) {
          // We're going to reply with an error and close the connection.
          // The client might not be able to read the error back. Read some data and wait
          // a bit to give client a chance to finish writing.

          auto dummy = kj::heap<HttpDiscardingEntityWriter>();
          auto lengthGrace = kj::evalNow([&]() {
            return httpInput.discard(*dummy, server.settings.canceledUploadGraceBytes);
          }).catch_([](kj::Exception&& e) -> void { })
            .attach(kj::mv(dummy));
          auto timeGrace = server.timer.afterDelay(server.settings.canceledUploadGracePeriod);
          co_await lengthGrace.exclusiveJoin(kj::mv(timeGrace));
        }

        // sendError() uses Response::send(), which requires that we have a currentMethod, but we
        // never read one. GET seems like the correct choice here.
        currentMethod = HttpMethod::GET;
        co_return co_await sendError(kj::mv(protocolError));
      }
    }

    KJ_UNREACHABLE;
  }